

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O2

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetMemoryBarriers
          (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
           *__return_storage_ptr__,ImageBase *this,
          vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  pointer pVVar1;
  VkImageSubresourceRange *pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  allocator_type local_31;
  
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(regions->
                   super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x14,&local_31);
  uVar8 = 0;
  while( true ) {
    uVar9 = (ulong)uVar8;
    pVVar3 = (regions->
             super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(regions->
                       super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) / 0x14) <= uVar9)
    break;
    pVVar4 = (__return_storage_ptr__->
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4[uVar9].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    pVVar4[uVar9].image = this->m_image;
    pVVar4[uVar9].oldLayout = old_layout;
    pVVar4[uVar9].newLayout = new_layout;
    pVVar4[uVar9].srcAccessMask = src_access_mask;
    pVVar4[uVar9].dstAccessMask = dst_access_mask;
    pVVar4[uVar9].srcQueueFamilyIndex = src_queue_family;
    pVVar4[uVar9].dstQueueFamilyIndex = dst_queue_family;
    pVVar1 = pVVar3 + uVar9;
    uVar5 = pVVar1->baseMipLevel;
    uVar6 = pVVar1->levelCount;
    uVar7 = pVVar1->baseArrayLayer;
    pVVar2 = &pVVar4[uVar9].subresourceRange;
    pVVar2->aspectMask = pVVar1->aspectMask;
    pVVar2->baseMipLevel = uVar5;
    pVVar2->levelCount = uVar6;
    pVVar2->baseArrayLayer = uVar7;
    pVVar4[uVar9].subresourceRange.layerCount = pVVar3[uVar9].layerCount;
    uVar8 = uVar8 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkImageMemoryBarrier> ImageBase::GetMemoryBarriers(const std::vector<VkImageSubresourceRange> &regions,
                                                               VkAccessFlags src_access_mask,
                                                               VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                               VkImageLayout new_layout, uint32_t src_queue_family,
                                                               uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		cur.subresourceRange = regions[i];
	}
	return barriers;
}